

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_layercontext.c
# Opt level: O0

void av1_one_pass_cbr_svc_start_layer(AV1_COMP *cpi)

{
  int *piVar1;
  AV1_COMP *cpi_00;
  long in_RDI;
  LAYER_CONTEXT *lc_prev;
  int height;
  int width;
  LAYER_CONTEXT *lc;
  AV1_COMMON *cm;
  SVC *svc;
  AV1_COMP *in_stack_ffffffffffffffd0;
  int local_28;
  int local_24;
  
  piVar1 = (int *)(in_RDI + 0x9d330);
  local_24 = 0;
  local_28 = 0;
  cpi_00 = (AV1_COMP *)
           (*(long *)(in_RDI + 0x9d488) +
           (long)(*piVar1 * *(int *)(in_RDI + 0x9d33c) + *(int *)(in_RDI + 0x9d334)) * 0x3380);
  *(undefined4 *)(in_RDI + 0x9d4ac) = 0;
  if (((0 < *(int *)(in_RDI + 0x9d330)) &&
      (in_stack_ffffffffffffffd0 =
            (AV1_COMP *)
            (*(long *)(in_RDI + 0x9d488) +
            (long)((*piVar1 + -1) * *(int *)(in_RDI + 0x9d33c) + *(int *)(in_RDI + 0x9d334)) *
            0x3380),
      *(int *)((in_stack_ffffffffffffffd0->enc_quant_dequant_params).quants.y_round[0x31] + 6) == 1)
      ) && (*(int *)((in_stack_ffffffffffffffd0->enc_quant_dequant_params).quants.y_round[0x31] + 4)
            == 1)) {
    *(undefined4 *)(in_RDI + 0x9d4ac) = 1;
  }
  av1_get_layer_resolution
            (*(int *)(in_RDI + 0x42338),*(int *)(in_RDI + 0x4233c),
             *(int *)((cpi_00->enc_quant_dequant_params).quants.y_round[0x31] + 4),
             *(int *)((cpi_00->enc_quant_dequant_params).quants.y_round[0x31] + 6),&local_24,
             &local_28);
  if (local_24 * local_28 < 0x12c01) {
    *(undefined1 *)(in_RDI + 0x9d494 + (long)*piVar1) = 1;
  }
  *(int *)(in_RDI + 0x3bfb8) = local_24;
  *(int *)(in_RDI + 0x3bfbc) = local_28;
  alloc_mb_mode_info_buffers(in_stack_ffffffffffffffd0);
  av1_update_frame_size(cpi_00);
  if (*piVar1 == *(int *)(in_RDI + 0x9d338) + -1) {
    *(undefined4 *)(in_RDI + 0x9d480) = *(undefined4 *)(in_RDI + 0x3c198);
    *(undefined4 *)(in_RDI + 0x9d484) = *(undefined4 *)(in_RDI + 0x3c194);
  }
  return;
}

Assistant:

void av1_one_pass_cbr_svc_start_layer(AV1_COMP *const cpi) {
  SVC *const svc = &cpi->svc;
  AV1_COMMON *const cm = &cpi->common;
  LAYER_CONTEXT *lc = NULL;
  int width = 0, height = 0;
  lc = &svc->layer_context[svc->spatial_layer_id * svc->number_temporal_layers +
                           svc->temporal_layer_id];
  // Set the lower quality layer flag.
  svc->has_lower_quality_layer = 0;
  if (cpi->svc.spatial_layer_id > 0) {
    const LAYER_CONTEXT *lc_prev =
        &svc->layer_context[(svc->spatial_layer_id - 1) *
                                svc->number_temporal_layers +
                            svc->temporal_layer_id];
    if (lc_prev->scaling_factor_den == 1 && lc_prev->scaling_factor_num == 1)
      svc->has_lower_quality_layer = 1;
  }
  av1_get_layer_resolution(cpi->oxcf.frm_dim_cfg.width,
                           cpi->oxcf.frm_dim_cfg.height, lc->scaling_factor_num,
                           lc->scaling_factor_den, &width, &height);
  // Use Eightap_smooth for low resolutions.
  if (width * height <= 320 * 240)
    svc->downsample_filter_type[svc->spatial_layer_id] = EIGHTTAP_SMOOTH;

  cm->width = width;
  cm->height = height;
  alloc_mb_mode_info_buffers(cpi);
  av1_update_frame_size(cpi);
  if (svc->spatial_layer_id == svc->number_spatial_layers - 1) {
    svc->mi_cols_full_resoln = cm->mi_params.mi_cols;
    svc->mi_rows_full_resoln = cm->mi_params.mi_rows;
  }
}